

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O2

ExprNode * parse_atom(ParserState *ps)

{
  Token TVar1;
  void *pvVar2;
  _Bool _Var3;
  uint uVar4;
  uint uVar5;
  ExprNode *pEVar6;
  ExprNode *pEVar7;
  ExprNode **ppEVar8;
  char *pcVar9;
  void *pvVar10;
  size_t sVar11;
  ptrlen pVar12;
  ptrlen input;
  ptrlen input_00;
  ptrlen input_01;
  ptrlen tail;
  
  TVar1 = ps->tok;
  if (TVar1 == TOK_ATOM) {
    _Var3 = atom_is_hostname_wc(ps->toktext);
    if (_Var3) {
      pEVar6 = exprnode_new(OP_HOSTNAME_WC,ps->toktext);
      ppEVar8 = (ExprNode **)mkstr(ps->toktext);
      (pEVar6->field_2).field_0.subexprs = ppEVar8;
      goto LAB_00160b1e;
    }
    pVar12.len = 5;
    pVar12.ptr = "port:";
    _Var3 = ptrlen_startswith(ps->toktext,pVar12,&tail);
    if (!_Var3) goto LAB_00160ba7;
    if (tail.len == 0) {
      sVar11 = 0;
LAB_00160c06:
      pvVar2 = tail.ptr;
      pvVar10 = memchr(tail.ptr,0x2d,sVar11);
      if (pvVar10 != (void *)0x0) {
        pVar12 = make_ptrlen_startend(pvVar2,pvVar10);
        input = make_ptrlen_startend
                          ((void *)((long)pvVar10 + 1),(void *)((long)tail.ptr + tail.len));
        if ((((pVar12.len != 0) && (_Var3 = ptrlen_contains_only(pVar12,"0123456789"), _Var3)) &&
            (input.len != 0)) && (_Var3 = ptrlen_contains_only(input,"0123456789"), _Var3)) {
          uVar4 = ptrlen_to_port_number(pVar12);
          if (0xffff < uVar4) {
            pcVar9 = dupstr("port number too large");
            input = pVar12;
            goto LAB_00160bc1;
          }
          uVar5 = ptrlen_to_port_number(input);
          if (0xffff < uVar5) {
            pcVar9 = dupstr("port number too large");
            goto LAB_00160bc1;
          }
          if (uVar5 < uVar4) {
            pcVar9 = dupstr("port number range is backwards");
            input = make_ptrlen_startend(pVar12.ptr,(void *)((long)input.ptr + input.len));
            goto LAB_00160bc1;
          }
LAB_00160cc4:
          pEVar6 = exprnode_new(OP_PORT_RANGE,ps->toktext);
          (pEVar6->field_2).field_3.lo = uVar4;
          (pEVar6->field_2).field_3.hi = uVar5;
LAB_00160b1e:
          advance(ps);
          return pEVar6;
        }
      }
      pcVar9 = "unable to parse port number specification";
      goto LAB_00160bae;
    }
    input_00.len = tail.len;
    input_00.ptr = tail.ptr;
    _Var3 = ptrlen_contains_only(input_00,"0123456789");
    sVar11 = tail.len;
    if (!_Var3) goto LAB_00160c06;
    input_01.len = tail.len;
    input_01.ptr = tail.ptr;
    uVar4 = ptrlen_to_port_number(input_01);
    uVar5 = uVar4;
    if (uVar4 < 0x10000) goto LAB_00160cc4;
    pcVar9 = dupstr("port number too large");
  }
  else {
    if (TVar1 == TOK_NOT) {
      pvVar2 = (ps->toktext).ptr;
      advance(ps);
      pEVar6 = parse_atom(ps);
      if (pEVar6 == (ExprNode *)0x0) {
        return (ExprNode *)0x0;
      }
      pVar12 = make_ptrlen_startend(pvVar2,(void *)((long)(pEVar6->text).ptr + (pEVar6->text).len));
      pEVar7 = exprnode_new(OP_NOT,pVar12);
      (pEVar7->field_2).field_0.subexprs = (ExprNode **)pEVar6;
      return pEVar7;
    }
    if (TVar1 == TOK_LPAR) {
      pvVar2 = (ps->toktext).ptr;
      advance(ps);
      pEVar6 = parse_expr(ps);
      if (pEVar6 == (ExprNode *)0x0) {
        return (ExprNode *)0x0;
      }
      if (ps->tok != TOK_RPAR) {
        pcVar9 = dupstr("expected \')\' after parenthesised subexpression");
        error(ps,pcVar9,pEVar6->text);
        exprnode_free(pEVar6);
        return (ExprNode *)0x0;
      }
      pvVar10 = (ps->toktext).ptr;
      sVar11 = (ps->toktext).len;
      advance(ps);
      pVar12 = make_ptrlen_startend(pvVar2,(void *)((long)pvVar10 + sVar11));
      pEVar6->text = pVar12;
      return pEVar6;
    }
LAB_00160ba7:
    pcVar9 = "expected a predicate or a parenthesised subexpression";
LAB_00160bae:
    pcVar9 = dupstr(pcVar9);
    tail.ptr = (ps->toktext).ptr;
    tail.len = (ps->toktext).len;
  }
  input.len = tail.len;
  input.ptr = tail.ptr;
LAB_00160bc1:
  error(ps,pcVar9,input);
  return (ExprNode *)0x0;
}

Assistant:

static ExprNode *parse_atom(ParserState *ps)
{
    if (ps->tok == TOK_LPAR) {
        ptrlen openpar = ps->toktext;
        advance(ps);                   /* eat the ( */

        ExprNode *subexpr = parse_expr(ps);
        if (!subexpr)
            return NULL;

        if (ps->tok != TOK_RPAR) {
            error(ps, dupstr("expected ')' after parenthesised subexpression"),
                  subexpr->text);
            exprnode_free(subexpr);
            return NULL;
        }

        ptrlen closepar = ps->toktext;
        advance(ps);                   /* eat the ) */

        /* We can reuse the existing AST node, but we need to extend
         * its bounds within the input expression to include the
         * parentheses */
        subexpr->text = make_ptrlen_startend(
            openpar.ptr, ptrlen_end(closepar));
        return subexpr;
    }

    if (ps->tok == TOK_NOT) {
        ptrlen notloc = ps->toktext;
        advance(ps);                   /* eat the ! */

        ExprNode *subexpr = parse_atom(ps);
        if (!subexpr)
            return NULL;

        ExprNode *en = exprnode_new(
            OP_NOT, make_ptrlen_startend(
                notloc.ptr, ptrlen_end(subexpr->text)));
        en->subexpr = subexpr;
        return en;
    }

    if (ps->tok == TOK_ATOM) {
        if (atom_is_hostname_wc(ps->toktext)) {
            /* Hostname wildcard. */
            ExprNode *en = exprnode_new(OP_HOSTNAME_WC, ps->toktext);
            en->wc = mkstr(ps->toktext);
            advance(ps);
            return en;
        }

        ptrlen tail;
        if (ptrlen_startswith(ps->toktext, PTRLEN_LITERAL("port:"), &tail)) {
            /* Port number (single or range). */
            unsigned lo, hi;
            char *minus;
            static const char DIGITS[] = "0123456789\0";
            bool parse_ok = false;

            if (tail.len > 0 && ptrlen_contains_only(tail, DIGITS)) {
                lo = ptrlen_to_port_number(tail);
                if (lo >= 65536) {
                    error(ps, dupstr("port number too large"), tail);
                    return NULL;
                }
                hi = lo;
                parse_ok = true;
            } else if ((minus = memchr(tail.ptr, '-', tail.len)) != NULL) {
                ptrlen pl_lo = make_ptrlen_startend(tail.ptr, minus);
                ptrlen pl_hi = make_ptrlen_startend(minus+1, ptrlen_end(tail));
                if (pl_lo.len > 0 && ptrlen_contains_only(pl_lo, DIGITS) &&
                    pl_hi.len > 0 && ptrlen_contains_only(pl_hi, DIGITS)) {

                    lo = ptrlen_to_port_number(pl_lo);
                    if (lo >= 65536) {
                        error(ps, dupstr("port number too large"), pl_lo);
                        return NULL;
                    }

                    hi = ptrlen_to_port_number(pl_hi);
                    if (hi >= 65536) {
                        error(ps, dupstr("port number too large"), pl_hi);
                        return NULL;
                    }

                    if (hi < lo) {
                        error(ps, dupstr("port number range is backwards"),
                              make_ptrlen_startend(pl_lo.ptr,
                                                   ptrlen_end(pl_hi)));
                        return NULL;
                    }

                    parse_ok = true;
                }
            }

            if (!parse_ok) {
                error(ps, dupstr("unable to parse port number specification"),
                      ps->toktext);
                return NULL;
            }


            ExprNode *en = exprnode_new(OP_PORT_RANGE, ps->toktext);
            en->lo = lo;
            en->hi = hi;
            advance(ps);
            return en;
        }
    }

    error(ps, dupstr("expected a predicate or a parenthesised subexpression"),
          ps->toktext);
    return NULL;
}